

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

int set_paramptr(FILE *paramfile)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ParamOutputLv PVar4;
  OdometryPtr p_Var5;
  size_t sVar6;
  char *pcVar7;
  rpf_t *prVar8;
  bool bVar9;
  double dVar10;
  double local_28d8;
  double default_value;
  int j_5;
  int j_4;
  int j_3;
  int num;
  char *num_end;
  char *num_start;
  int eof;
  int j_2;
  int j_1;
  int param_error;
  OdometryPtr odm;
  uint local_2890;
  int motor_num;
  int param_num;
  int read_state;
  int str_wp;
  int c;
  int j;
  int i;
  char value_str [100];
  char local_2808 [8];
  char name [32];
  anon_struct_12_3_a1ab889c param_alias [2];
  long local_27c8;
  variables_t variables [257];
  char variable_names [37] [20];
  int local_14c8 [2];
  int param_necessary [73];
  char local_1398 [8];
  char param_names1 [73] [24];
  char local_cb8 [8];
  char param_names0 [73] [24];
  char local_5d8 [8];
  char param_names [73] [20];
  FILE *paramfile_local;
  
  memcpy(local_5d8,"VERSION",0x5b4);
  memcpy(local_cb8,"VERSION",0x6d8);
  memcpy(local_1398,"VERSION",0x6d8);
  memcpy(local_14c8,&DAT_0011b6c0,0x124);
  memcpy(&variables[0x100].pointer,&DAT_0011b7f0,0x2e4);
  name[0x18] = '\x11';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\x0f';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  param_alias[0].alias = YP_PARAM_TORQUE_UNIT;
  param_alias[0].param = YP_PARAM_RADIUS_R;
  param_alias[0].motor = 0xf;
  param_alias[1].alias = YP_PARAM_VERSION;
  bVar1 = false;
  for (c = 0; c < 0x49; c = c + 1) {
    strcat(param_names0[(long)c + -1] + 0x10,"[0]");
    strcat(param_names1[(long)c + -1] + 0x10,"[1]");
    variables[(long)(c * 3) + -1].pointer = (double *)(param_names[(long)c + -1] + 0xc);
    variables[c * 3].name = (char *)(g_P + c);
    variables[(long)(c * 3 + 1) + -1].pointer = (double *)(param_names0[(long)c + -1] + 0x10);
    variables[c * 3 + 1].name = (char *)(g_P + c);
    variables[(long)(c * 3 + 2) + -1].pointer = (double *)(param_names1[(long)c + -1] + 0x10);
    variables[c * 3 + 2].name = (char *)((long)c * 0x80 + 0x121db8);
  }
  iVar3 = c * 3;
  for (str_wp = 0; str_wp < 0x25; str_wp = str_wp + 1) {
    variables[(long)(iVar3 + str_wp) + -1].pointer =
         (double *)(variable_names[(long)str_wp + -1] + 0xc);
  }
  p_Var5 = get_odometry_ptr();
  variables[iVar3].name = (char *)p_Var5;
  variables[iVar3 + 1].name = (char *)&p_Var5->y;
  variables[iVar3 + 2].name = (char *)&p_Var5->theta;
  variables[iVar3 + 3].name = (char *)&p_Var5->v;
  variables[iVar3 + 4].name = (char *)&p_Var5->w;
  c = iVar3 + 5;
  for (str_wp = 0; str_wp < 0x10; str_wp = str_wp + 1) {
    variables[c].name = (char *)(p_Var5->wvel + str_wp);
    c = c + 1;
  }
  for (str_wp = 0; str_wp < 0x10; str_wp = str_wp + 1) {
    variables[c].name = (char *)(p_Var5->wang + str_wp);
    c = c + 1;
  }
  variables[(long)c + -1].pointer = (double *)0x0;
  variables[c].name = (char *)0x0;
  for (c = 0; c < 0x49; c = c + 1) {
    for (eof = 0; eof < 0x10; eof = eof + 1) {
      g_P_changed[c][eof] = 0;
    }
  }
  if (g_param_init != 0) {
    for (num_start._4_4_ = 0; num_start._4_4_ < 0x10; num_start._4_4_ = num_start._4_4_ + 1) {
      g_P_changed[3][num_start._4_4_] = 1;
      g_param.motor_enable[num_start._4_4_] = 0;
    }
    for (c = 0; c < 0x49; c = c + 1) {
      for (num_start._4_4_ = 0; num_start._4_4_ < 0x10; num_start._4_4_ = num_start._4_4_ + 1) {
        g_P[c][num_start._4_4_] = 0.0;
        g_P_set[c][num_start._4_4_] = 0;
        g_Pf[c][num_start._4_4_] = (rpf_t *)0x0;
      }
    }
  }
  motor_num = 0;
  param_num = 0;
  odm._4_4_ = YP_PARAM_VERSION;
  local_2890 = 0x49;
LAB_0010fc61:
  read_state = getc((FILE *)paramfile);
  bVar9 = read_state == -1;
  if (bVar9) {
    read_state = 10;
  }
  cVar2 = (char)read_state;
  switch(motor_num) {
  case 0:
    if (read_state == 0x23) {
      motor_num = 1;
    }
    iVar3 = is_character(read_state);
    if ((iVar3 != 0) || (read_state == 0x2d)) {
      motor_num = 2;
      param_num = 1;
      local_2808[0] = cVar2;
    }
    break;
  case 1:
    if (read_state == 10) {
      motor_num = 0;
    }
    break;
  case 2:
    local_2808[param_num] = cVar2;
    iVar3 = is_character(read_state);
    if ((((iVar3 == 0) && (iVar3 = is_number(read_state), iVar3 == 0)) && (read_state != 0x5b)) &&
       ((read_state != 0x5d && (read_state != 0x2d)))) {
      local_2808[param_num] = '\0';
      motor_num = 3;
      param_num = 0;
    }
    else {
      param_num = param_num + 1;
    }
    break;
  case 3:
    iVar3 = is_number(read_state);
    if (iVar3 == 0) {
      if (read_state == 0x3d) {
        strcpy((char *)&j,local_2808);
        strcat((char *)&j,"=");
        sVar6 = strlen((char *)&j);
        param_num = (int)sVar6;
        motor_num = 5;
      }
    }
    else {
      param_num = 1;
      motor_num = 4;
      j._0_1_ = cVar2;
    }
    if (motor_num == 3) break;
    _j_3 = (char *)0x0;
    local_2890 = 0x49;
    j_4 = -1;
    pcVar7 = strchr(local_2808,0x5b);
    num_end = pcVar7;
    if (pcVar7 != (char *)0x0) {
      num_end = pcVar7 + 1;
      _j_3 = strchr(local_2808,0x5d);
      if (_j_3 == (char *)0x0) {
        motor_num = 4;
        yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2808);
        bVar1 = true;
        goto LAB_0010fc61;
      }
      *pcVar7 = '\0';
      *_j_3 = '\0';
      j_4 = atoi(num_end);
    }
    odm._4_4_ = j_4;
    for (c = 0; c < 0x49; c = c + 1) {
      iVar3 = strcmp(local_2808,param_names[(long)c + -1] + 0xc);
      if (iVar3 == 0) {
        j_5 = 0;
        goto LAB_0010ff84;
      }
    }
    goto LAB_00110093;
  case 4:
    iVar3 = is_number(read_state);
    if (iVar3 == 0) {
      *(undefined1 *)((long)&j + (long)param_num) = 0;
      if (local_2890 == 0x49) {
        yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2808);
        bVar1 = true;
      }
      else if (odm._4_4_ == ~YP_PARAM_VERSION) {
        for (default_value._4_4_ = 0; default_value._4_4_ < 0x10;
            default_value._4_4_ = default_value._4_4_ + 1) {
          dVar10 = strtod((char *)&j,(char **)0x0);
          g_P[(int)local_2890][default_value._4_4_] = dVar10;
          g_P_set[(int)local_2890][default_value._4_4_] = 1;
          g_P_changed[(int)local_2890][default_value._4_4_] = 1;
          if (g_Pf[(int)local_2890][default_value._4_4_] != (rpf_t *)0x0) {
            formula_free(g_Pf[(int)local_2890][default_value._4_4_]);
            g_Pf[(int)local_2890][default_value._4_4_] = (rpf_t *)0x0;
          }
        }
        yprintf(OUTPUT_LV_DEBUG,"%d %s %f\n",g_P[(int)local_2890][0],(ulong)local_2890,
                param_names[(long)(int)local_2890 + -1] + 0xc);
      }
      else {
        dVar10 = strtod((char *)&j,(char **)0x0);
        g_P[(int)local_2890][(int)odm._4_4_] = dVar10;
        g_P_set[(int)local_2890][(int)odm._4_4_] = 1;
        g_P_changed[(int)local_2890][(int)odm._4_4_] = 1;
        g_param.motor_enable[(int)odm._4_4_] = 1;
        if (g_Pf[(int)local_2890][(int)odm._4_4_] != (rpf_t *)0x0) {
          formula_free(g_Pf[(int)local_2890][(int)odm._4_4_]);
          g_Pf[(int)local_2890][(int)odm._4_4_] = (rpf_t *)0x0;
        }
        yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] %f\n",g_P[(int)local_2890][(int)odm._4_4_],
                (ulong)local_2890,param_names[(long)(int)local_2890 + -1] + 0xc,(ulong)odm._4_4_);
      }
      local_2890 = 0x49;
      motor_num = 0;
      param_num = 0;
    }
    else {
      *(char *)((long)&j + (long)param_num) = cVar2;
      param_num = param_num + 1;
    }
    break;
  case 5:
    if ((read_state == 0x23) || (read_state == 10)) {
      *(undefined1 *)((long)&j + (long)param_num) = 0;
      if (local_2890 == 0x49) {
        yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2808);
        bVar1 = true;
      }
      else if (odm._4_4_ == ~YP_PARAM_VERSION) {
        for (default_value._0_4_ = 0; default_value._0_4_ < 0x10;
            default_value._0_4_ = default_value._0_4_ + 1) {
          g_P[(int)local_2890][default_value._0_4_] = 0.0;
          g_P_set[(int)local_2890][default_value._0_4_] = 1;
          if (g_Pf[(int)local_2890][default_value._0_4_] != (rpf_t *)0x0) {
            formula_free(g_Pf[(int)local_2890][default_value._0_4_]);
          }
          formula(&j,g_Pf[(int)local_2890] + default_value._0_4_,&local_27c8);
        }
        if (g_Pf[(int)local_2890][0] == (rpf_t *)0x0) {
          yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",&j);
          bVar1 = true;
        }
        else {
          for (default_value._0_4_ = 0; default_value._0_4_ < 0x10;
              default_value._0_4_ = default_value._0_4_ + 1) {
            prVar8 = (rpf_t *)formula_optimize(g_Pf[(int)local_2890][default_value._0_4_]);
            g_Pf[(int)local_2890][default_value._0_4_] = prVar8;
          }
          yprintf(OUTPUT_LV_DEBUG,"%d %s ",(ulong)local_2890,
                  param_names[(long)(int)local_2890 + -1] + 0xc);
          PVar4 = output_lv();
          if (OUTPUT_LV_INFO < PVar4) {
            formula_print(_stderr,g_Pf[(int)local_2890][0]);
          }
          yprintf(OUTPUT_LV_DEBUG,"\n");
        }
      }
      else {
        g_P[(int)local_2890][(int)odm._4_4_] = 0.0;
        g_P_set[(int)local_2890][(int)odm._4_4_] = 1;
        if (g_Pf[(int)local_2890][(int)odm._4_4_] != (rpf_t *)0x0) {
          formula_free(g_Pf[(int)local_2890][(int)odm._4_4_]);
        }
        formula(&j,g_Pf[(int)local_2890] + (int)odm._4_4_,&local_27c8);
        if (g_Pf[(int)local_2890][(int)odm._4_4_] == (rpf_t *)0x0) {
          yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",&j);
          bVar1 = true;
        }
        else {
          prVar8 = (rpf_t *)formula_optimize(g_Pf[(int)local_2890][(int)odm._4_4_]);
          g_Pf[(int)local_2890][(int)odm._4_4_] = prVar8;
          yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] ",(ulong)local_2890,
                  param_names[(long)(int)local_2890 + -1] + 0xc,(ulong)odm._4_4_);
          PVar4 = output_lv();
          if (OUTPUT_LV_INFO < PVar4) {
            formula_print(_stderr,g_Pf[(int)local_2890][(int)odm._4_4_]);
          }
          yprintf(OUTPUT_LV_DEBUG,"\n");
        }
      }
      local_2890 = 0x49;
      motor_num = 0;
      param_num = 0;
    }
    else {
      *(char *)((long)&j + (long)param_num) = cVar2;
      param_num = param_num + 1;
    }
  }
switchD_0010fcc3_default:
  if (bVar9) {
    fclose((FILE *)paramfile);
    if (4.0 <= g_P[0][0]) {
      if (g_P[0][0] <= 5.0) {
        for (c = 0; c < 0x49; c = c + 1) {
          for (str_wp = 0; str_wp < 0x10; str_wp = str_wp + 1) {
            if (((g_param.motor_enable[str_wp] != 0) && (param_necessary[(long)c + -2] != 0)) &&
               (g_P_set[c][str_wp] == 0)) {
              yprintf(OUTPUT_LV_ERROR,"Error: %s[%d] undefined!\n",param_names[(long)c + -1] + 0xc,
                      (ulong)(uint)str_wp);
              bVar1 = true;
            }
          }
        }
        if (bVar1) {
          paramfile_local._4_4_ = 0;
        }
        else {
          g_param.num_motor_enable = 0;
          for (str_wp = 0; str_wp < 0x10; str_wp = str_wp + 1) {
            if (g_param.motor_enable[str_wp] != 0) {
              g_param.num_motor_enable = g_param.num_motor_enable + 1;
            }
          }
          if (g_param.num_motor_enable == 0) {
            g_param.motor_enable[1] = 1;
            g_param.motor_enable[0] = 1;
            g_param.num_motor_enable = 2;
          }
          for (str_wp = 0; str_wp < 0x10; str_wp = str_wp + 1) {
            if (g_param.motor_enable[str_wp] != 0) {
              if ((g_P_changed[0x40][str_wp] != 0) && (g_P_set[0x40][str_wp] != 0)) {
                if (g_P[0][0] < 5.0) {
                  yprintf(OUTPUT_LV_ERROR,
                          "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n"
                         );
                  return 0;
                }
                yprintf(OUTPUT_LV_WARNING,
                        "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n The behavior of this parameter may be changed in the future update.\n"
                       );
              }
              if (g_P_set[0x27][str_wp] == 0) {
                yprintf(OUTPUT_LV_WARNING,
                        "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n",
                        (ulong)(uint)str_wp,(ulong)(uint)str_wp);
                g_P[0x27][str_wp] = g_P[0x20][str_wp];
                iVar3 = ischanged_p(YP_PARAM_TORQUE_MAX,str_wp);
                g_P_changed[0x27][str_wp] = iVar3;
              }
              if (g_P_set[0x3b][str_wp] == 0) {
                if (str_wp < 2) {
                  local_28d8 = 1.0;
                }
                else {
                  local_28d8 = 0.0;
                }
                if ((g_P[0x3b][str_wp] != local_28d8) || (NAN(g_P[0x3b][str_wp]) || NAN(local_28d8))
                   ) {
                  g_P_changed[0x3b][str_wp] = 1;
                }
                g_P[0x3b][str_wp] = local_28d8;
              }
              if (g_P_set[5][str_wp] == 0) {
                if ((g_P[5][str_wp] != 2.0) || (NAN(g_P[5][str_wp]))) {
                  g_P_changed[5][str_wp] = 1;
                }
                g_P[5][str_wp] = 2.0;
              }
              if (g_P_set[0x45][str_wp] == 0) {
                if ((g_P[0x45][str_wp] != 1.0) || (NAN(g_P[0x45][str_wp]))) {
                  g_P_changed[0x45][str_wp] = 1;
                }
                g_P[0x45][str_wp] = 1.0;
              }
              if (g_P_set[0x40][str_wp] == 0) {
                if ((g_P[0x40][str_wp] != 1.0) || (NAN(g_P[0x40][str_wp]))) {
                  g_P_changed[0x40][str_wp] = 1;
                }
                g_P[0x40][str_wp] = 1.0;
              }
              if (g_P_set[0x46][str_wp] == 0) {
                g_P[0x46][str_wp] = 0.3;
              }
              g_P[1][str_wp] = 1.0 / g_P[2][str_wp];
              iVar3 = ischanged_p(YP_PARAM_TORQUE_FINENESS,str_wp);
              g_P_changed[1][str_wp] = iVar3;
            }
          }
          if (g_P_set[0x47][0] == 0) {
            g_P[0x47][0] = g_P[0x13][0];
          }
          else if (g_P[0x47][0] <= 0.0) {
            yprintf(OUTPUT_LV_ERROR,"ERROR: MAX_TIME_JUMP must be > 0.0.\n");
            bVar1 = true;
          }
          if (g_P_set[0x48][0] == 0) {
            g_P[0x48][0] = g_P[0x13][0];
          }
          else if (g_P[0x48][0] <= 0.0) {
            yprintf(OUTPUT_LV_ERROR,"ERROR: -MAX_TIME_JUMP must be > 0.0.\n");
            bVar1 = true;
          }
          if (bVar1) {
            paramfile_local._4_4_ = 0;
          }
          else {
            calc_param_inertia2ff();
            enable_state(YP_STATE_MOTOR);
            enable_state(YP_STATE_VELOCITY);
            enable_state(YP_STATE_BODY);
            enable_state(YP_STATE_TRACKING);
            yprintf(OUTPUT_LV_DEBUG,"Info: %d motors defined\n",
                    (ulong)(uint)g_param.num_motor_enable);
            paramfile_local._4_4_ = 1;
          }
        }
      }
      else {
        yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is unsupported!\n");
        yprintf(OUTPUT_LV_ERROR,"Error: Please install newer version of YP-Spur.\n");
        yprintf(OUTPUT_LV_ERROR,"Error: This program supports %3.1f.\n",0x4014000000000000);
        paramfile_local._4_4_ = 0;
      }
    }
    else {
      yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is too old!\n");
      yprintf(OUTPUT_LV_ERROR,"Error: This program requires %3.1f.\n",0x4010000000000000);
      paramfile_local._4_4_ = 0;
    }
    return paramfile_local._4_4_;
  }
  goto LAB_0010fc61;
LAB_0010ff84:
  if (1 < j_5) goto LAB_0011006f;
  if (c == param_alias[(long)j_5 + -1].param) {
    yprintf(OUTPUT_LV_WARNING,"Parameter alias: %s -> %s[%d]\n",param_names[(long)c + -1] + 0xc,
            param_names[(ulong)(uint)param_alias[(long)j_5 + -1].motor - 1] + 0xc,
            (ulong)param_alias[j_5].alias);
    c = param_alias[(long)j_5 + -1].motor;
    odm._4_4_ = param_alias[j_5].alias;
    goto LAB_0011006f;
  }
  j_5 = j_5 + 1;
  goto LAB_0010ff84;
LAB_0011006f:
  local_2890 = c;
LAB_00110093:
  if (num_end != (char *)0x0) {
    num_end[-1] = '[';
    *_j_3 = ']';
  }
  goto switchD_0010fcc3_default;
}

Assistant:

int set_paramptr(FILE* paramfile)
{
  char param_names[YP_PARAM_NUM][20] = YP_PARAM_NAME;
  char param_names0[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  char param_names1[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  int param_necessary[YP_PARAM_NUM] = YP_PARAM_NECESSARY;
#define VARIABLE_NUM 37
  char variable_names[VARIABLE_NUM][20] =
      {
          "X",
          "Y",
          "THETA",
          "V",
          "W",
          "WHEEL_VEL[0]",
          "WHEEL_VEL[1]",
          "WHEEL_VEL[2]",
          "WHEEL_VEL[3]",
          "WHEEL_VEL[4]",
          "WHEEL_VEL[5]",
          "WHEEL_VEL[6]",
          "WHEEL_VEL[7]",
          "WHEEL_VEL[8]",
          "WHEEL_VEL[9]",
          "WHEEL_VEL[10]",
          "WHEEL_VEL[11]",
          "WHEEL_VEL[12]",
          "WHEEL_VEL[13]",
          "WHEEL_VEL[14]",
          "WHEEL_VEL[15]",
          "WHEEL_ANGLE[0]",
          "WHEEL_ANGLE[1]",
          "WHEEL_ANGLE[2]",
          "WHEEL_ANGLE[3]",
          "WHEEL_ANGLE[4]",
          "WHEEL_ANGLE[5]",
          "WHEEL_ANGLE[6]",
          "WHEEL_ANGLE[7]",
          "WHEEL_ANGLE[8]",
          "WHEEL_ANGLE[9]",
          "WHEEL_ANGLE[10]",
          "WHEEL_ANGLE[11]",
          "WHEEL_ANGLE[12]",
          "WHEEL_ANGLE[13]",
          "WHEEL_ANGLE[14]",
          "WHEEL_ANGLE[15]",
      };
  struct variables_t variables[YP_PARAM_NUM * 3 + 1 + VARIABLE_NUM];
  struct
  {
    YPSpur_param alias;
    YPSpur_param param;
    int motor;
  } param_alias[YP_PARAM_ALIAS_NUM] = YP_PARAM_ALIAS;
  char name[32], value_str[100];
  int i, j, c;
  int str_wp;
  int read_state;
  int param_num, motor_num;
  OdometryPtr odm;
  int param_error = 0;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    strcat(param_names0[i], "[0]");
    strcat(param_names1[i], "[1]");
    variables[i * 3 + 0].name = param_names[i];
    variables[i * 3 + 0].pointer = &g_P[i][0];
    variables[i * 3 + 1].name = param_names0[i];
    variables[i * 3 + 1].pointer = &g_P[i][0];
    variables[i * 3 + 2].name = param_names1[i];
    variables[i * 3 + 2].pointer = &g_P[i][1];
  }
  i = i * 3;
  for (j = 0; j < VARIABLE_NUM; j++)
  {
    variables[i + j].name = variable_names[j];
  }
  odm = get_odometry_ptr();
  variables[i++].pointer = &odm->x;
  variables[i++].pointer = &odm->y;
  variables[i++].pointer = &odm->theta;
  variables[i++].pointer = &odm->v;
  variables[i++].pointer = &odm->w;
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wvel[j];
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wang[j];
  variables[i].name = NULL;
  variables[i].pointer = NULL;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[i][j] = 0;
    }
  }
  if (g_param_init)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[YP_PARAM_PWM_MAX][j] = 1;
      g_param.motor_enable[j] = 0;
    }
    // パラメータの初期化
    for (i = 0; i < YP_PARAM_NUM; i++)
    {
      for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
      {
        g_P[i][j] = 0;
        g_P_set[i][j] = 0;
        g_Pf[i][j] = NULL;
      }
    }
  }

  // パラメータファイルの読み込み
  read_state = 0;
  str_wp = 0;
  motor_num = 0;
  param_num = YP_PARAM_NUM;
  while (1)
  {
    int eof = 0;

    c = getc(paramfile);
    if (c == EOF)
    {
      eof = 1;
      c = '\n';
    }

    switch (read_state)
    {
      case 0:
        /* - */
        if (c == '#')
        {
          read_state = 1;
        }
        if (is_character(c) || c == '-')
        {
          name[0] = c;
          read_state = 2;
          str_wp = 1;
        }
        break;
      case 1: /* comment */
        if (c == '\n')
        {
          read_state = 0;
        }
        break;
      case 2: /* name */
        name[str_wp] = c;
        if (!(is_character(c) || is_number(c) || c == '[' || c == ']' || c == '-'))
        {
          name[str_wp] = 0;
          read_state = 3;
          str_wp = 0;
        }
        else
        {
          str_wp++;
        }
        break;
      case 3: /* value */
        if (is_number(c))
        {
          str_wp = 0;
          value_str[str_wp] = c;
          str_wp++;
          read_state = 4;
        }
        else if (c == '=')
        {
          strcpy(value_str, name);
          strcat(value_str, "=");
          str_wp = strlen(value_str);
          read_state = 5;
        }
        if (read_state != 3)
        {
          char* num_start;
          char* num_end = NULL;
          int num;

          param_num = YP_PARAM_NUM;
          num = -1;

          num_start = strchr(name, '[');
          if (num_start)
          {
            num_start++;
            num_end = strchr(name, ']');
            if (!num_end)
            {
              read_state = 4;
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
              param_error = 1;
              continue;
            }
            *(num_start - 1) = 0;
            *num_end = 0;
            num = atoi(num_start);
          }
          motor_num = num;
          for (i = 0; i < YP_PARAM_NUM; i++)
          {
            if (!strcmp(name, param_names[i]))
            {
              int j;
              for (j = 0; j < YP_PARAM_ALIAS_NUM; j++)
              {
                if (i == param_alias[j].alias)
                {
                  yprintf(OUTPUT_LV_WARNING, "Parameter alias: %s -> %s[%d]\n",
                          param_names[i], param_names[param_alias[j].param], param_alias[j].motor);
                  i = param_alias[j].param;
                  motor_num = param_alias[j].motor;
                  break;
                }
              }
              param_num = i;
              break;
            }
          }
          if (num_start)
          {
            *(num_start - 1) = '[';
            *num_end = ']';
          }
        }
        break;
      case 4: /* value */
        if (!is_number(c))
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = strtod(value_str, 0);
              g_P_set[param_num][j] = 1;
              g_P_changed[param_num][j] = 1;
              if (g_Pf[param_num][j])
              {
                formula_free(g_Pf[param_num][j]);
                g_Pf[param_num][j] = NULL;
              }
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s %f\n", param_num, param_names[param_num], g_P[param_num][0]);
          }
          else
          {
            g_P[param_num][motor_num] = strtod(value_str, 0);
            g_P_set[param_num][motor_num] = 1;
            g_P_changed[param_num][motor_num] = 1;
            g_param.motor_enable[motor_num] = 1;
            if (g_Pf[param_num][motor_num])
            {
              formula_free(g_Pf[param_num][motor_num]);
              g_Pf[param_num][motor_num] = NULL;
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] %f\n", param_num, param_names[param_num], motor_num,
                    g_P[param_num][motor_num]);
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
      case 5: /* value */
        if (c == '#' || c == '\n')
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = 0;
              g_P_set[param_num][j] = 1;
              if (g_Pf[param_num][j])
                formula_free(g_Pf[param_num][j]);
              formula(value_str, &g_Pf[param_num][j], variables);
            }
            if (g_Pf[param_num][0] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
              {
                g_Pf[param_num][j] = formula_optimize(g_Pf[param_num][j]);
              }
              yprintf(OUTPUT_LV_DEBUG, "%d %s ", param_num, param_names[param_num]);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][0]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          else
          {
            g_P[param_num][motor_num] = 0;
            g_P_set[param_num][motor_num] = 1;
            if (g_Pf[param_num][motor_num])
              formula_free(g_Pf[param_num][motor_num]);
            formula(value_str, &g_Pf[param_num][motor_num], variables);
            if (g_Pf[param_num][motor_num] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              g_Pf[param_num][motor_num] = formula_optimize(g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] ", param_num, param_names[param_num], motor_num);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
    }
    if (eof)
      break;
  }

  fclose(paramfile);
  if (g_P[YP_PARAM_VERSION][0] < YP_PARAM_REQUIRED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is too old!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program requires %3.1f.\n", YP_PARAM_REQUIRED_VERSION);
    return 0;
  }
  if (g_P[YP_PARAM_VERSION][0] > YP_PARAM_SUPPORTED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is unsupported!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: Please install newer version of YP-Spur.\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program supports %3.1f.\n", YP_PARAM_SUPPORTED_VERSION);
    return 0;
  }

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (!g_param.motor_enable[j])
        continue;
      if (param_necessary[i] && !g_P_set[i][j])
      {
        yprintf(OUTPUT_LV_ERROR, "Error: %s[%d] undefined!\n", param_names[i], j);
        param_error = 1;
      }
    }
  }
  if (param_error)
  {
    return 0;
  }

  g_param.num_motor_enable = 0;
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    // Count motor number
    if (g_param.motor_enable[j])
      g_param.num_motor_enable++;
  }
  if (g_param.num_motor_enable == 0)
  {
    // If all parameters are common among motors, treat num_motor_enable as two
    g_param.motor_enable[0] = g_param.motor_enable[1] = 1;
    g_param.num_motor_enable = 2;
  }

  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;

    // Verify parameter version compatibility
    if (g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] &&
        g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_VERSION][0] < 5.0)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n"
            " Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n");
        return 0;
      }
      yprintf(
          OUTPUT_LV_WARNING,
          "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n"
          " The behavior of this parameter may be changed in the future update.\n");
    }

    // Check and fill undefined parameters
    if (!g_P_set[YP_PARAM_TORQUE_LIMIT][j])
    {
      yprintf(OUTPUT_LV_WARNING, "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n", j, j);
      g_P[YP_PARAM_TORQUE_LIMIT][j] = g_P[YP_PARAM_TORQUE_MAX][j];
      g_P_changed[YP_PARAM_TORQUE_LIMIT][j] = ischanged_p(YP_PARAM_TORQUE_MAX, j);
    }

    if (!g_P_set[YP_PARAM_VEHICLE_CONTROL][j])
    {
      double default_value;
      if (j < 2)
        default_value = 1.0;
      else
        default_value = 0.0;

      if (g_P[YP_PARAM_VEHICLE_CONTROL][j] != default_value)
        g_P_changed[YP_PARAM_VEHICLE_CONTROL][j] = 1;
      g_P[YP_PARAM_VEHICLE_CONTROL][j] = default_value;
    }

    if (!g_P_set[YP_PARAM_ENCODER_TYPE][j])
    {
      if (g_P[YP_PARAM_ENCODER_TYPE][j] != 2.0)
        g_P_changed[YP_PARAM_ENCODER_TYPE][j] = 1;
      g_P[YP_PARAM_ENCODER_TYPE][j] = 2.0;
    }
    if (!g_P_set[YP_PARAM_INDEX_GEAR][j])
    {
      if (g_P[YP_PARAM_INDEX_GEAR][j] != 1.0)
        g_P_changed[YP_PARAM_INDEX_GEAR][j] = 1;
      g_P[YP_PARAM_INDEX_GEAR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_ENCODER_DENOMINATOR][j] != 1.0)
        g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] = 1;
      g_P[YP_PARAM_ENCODER_DENOMINATOR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_DEVICE_TIMEOUT][j])
    {
      // YP_PARAM_DEVICE_TIMEOUT is always sent on reloading.
      // g_P_changed is not needed to be marked.
      g_P[YP_PARAM_DEVICE_TIMEOUT][j] = 0.3;
    }

    // Process internally calculated parameters
    g_P[YP_PARAM_TORQUE_UNIT][j] = 1.0 / g_P[YP_PARAM_TORQUE_FINENESS][j];
    g_P_changed[YP_PARAM_TORQUE_UNIT][j] = ischanged_p(YP_PARAM_TORQUE_FINENESS, j);
  }

  if (g_P_set[YP_PARAM_MAX_TIME_JUMP][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }
  if (g_P_set[YP_PARAM_MAX_TIME_JUMP_NEG][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: -MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }

  if (param_error)
  {
    return 0;
  }

  // パラメータの指定によって自動的に求まるパラメータの計算
  calc_param_inertia2ff();

  /* パラメータを有効にする */
  enable_state(YP_STATE_MOTOR);
  enable_state(YP_STATE_VELOCITY);
  enable_state(YP_STATE_BODY);
  enable_state(YP_STATE_TRACKING);

  yprintf(OUTPUT_LV_DEBUG, "Info: %d motors defined\n", g_param.num_motor_enable);

  return 1;
}